

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

uint8_t * JS_WriteObject2(JSContext *ctx,size_t *psize,JSValue obj,int flags,uint8_t ***psab_tab,
                         size_t *psab_tab_len)

{
  DynBuf *s;
  JSRuntime *pJVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  DynBuf local_f8;
  BCWriterState ss;
  
  s = &ss.dbuf;
  memset(s,0,0x88);
  ss._56_4_ = (flags & 8U) << 0x15 | (flags & 4U) << 0xe | (uint)flags >> 1 & 1 | (flags & 1U) << 8;
  ss.first_atom = 0xd2;
  if ((flags & 1U) == 0) {
    ss.first_atom = 1;
  }
  ss.ctx = ctx;
  js_dbuf_init(ctx,s);
  ss.object_list.hash_table = (uint32_t *)0x0;
  ss.object_list.hash_size = 0;
  ss.object_list._28_4_ = 0;
  ss.object_list.object_tab = (JSObjectListEntry *)0x0;
  ss.object_list.object_count = 0;
  ss.object_list.object_size = 0;
  iVar2 = JS_WriteObjectRec(&ss,obj);
  if (iVar2 == 0) {
    pJVar1 = (ss.ctx)->rt;
    local_f8.realloc_func = ss.dbuf.realloc_func;
    local_f8.opaque = ss.dbuf.opaque;
    local_f8.allocated_size = ss.dbuf.allocated_size;
    local_f8.error = ss.dbuf.error;
    local_f8._28_4_ = ss.dbuf._28_4_;
    local_f8.buf = ss.dbuf.buf;
    local_f8.size = ss.dbuf.size;
    js_dbuf_init(ss.ctx,s);
    dbuf_putc(s,(ss._56_1_ != '\0') * '@' + '\x01');
    dbuf_put_leb128(s,ss.idx_to_atom_count);
    for (lVar3 = 0; lVar3 < ss.idx_to_atom_count; lVar3 = lVar3 + 1) {
      JS_WriteString(&ss,pJVar1->atom_array[ss.idx_to_atom[lVar3]]);
    }
    __n = (size_t)(int)ss.dbuf.size;
    iVar2 = dbuf_realloc(&local_f8,local_f8.size + __n);
    if (iVar2 == 0) {
      memmove(local_f8.buf + __n,local_f8.buf,local_f8.size);
      memcpy(local_f8.buf,ss.dbuf.buf,__n);
      local_f8.size = local_f8.size + __n;
      dbuf_free(&ss.dbuf);
      ss.dbuf.realloc_func = local_f8.realloc_func;
      ss.dbuf.opaque = local_f8.opaque;
      ss.dbuf.allocated_size = local_f8.allocated_size;
      ss.dbuf.error = local_f8.error;
      ss.dbuf._28_4_ = local_f8._28_4_;
      ss.dbuf.buf = local_f8.buf;
      ss.dbuf.size = local_f8.size;
      js_object_list_end(ctx,&ss.object_list);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,ss.atom_to_idx);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,ss.idx_to_atom);
      *psize = ss.dbuf.size;
      if (psab_tab != (uint8_t ***)0x0) {
        *psab_tab = ss.sab_tab;
      }
      if (psab_tab_len == (size_t *)0x0) {
        return ss.dbuf.buf;
      }
      *psab_tab_len = (long)ss.sab_tab_len;
      return ss.dbuf.buf;
    }
    dbuf_free(&local_f8);
  }
  js_object_list_end(ctx,&ss.object_list);
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,ss.atom_to_idx);
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,ss.idx_to_atom);
  dbuf_free(&ss.dbuf);
  *psize = 0;
  if (psab_tab != (uint8_t ***)0x0) {
    *psab_tab = (uint8_t **)0x0;
  }
  if (psab_tab_len != (size_t *)0x0) {
    *psab_tab_len = 0;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *JS_WriteObject2(JSContext *ctx, size_t *psize, JSValueConst obj,
                         int flags, uint8_t ***psab_tab, size_t *psab_tab_len)
{
    BCWriterState ss, *s = &ss;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    /* XXX: byte swapped output is untested */
    s->byte_swap = ((flags & JS_WRITE_OBJ_BSWAP) != 0);
    s->allow_bytecode = ((flags & JS_WRITE_OBJ_BYTECODE) != 0);
    s->allow_sab = ((flags & JS_WRITE_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_WRITE_OBJ_REFERENCE) != 0);
    /* XXX: could use a different version when bytecode is included */
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    js_dbuf_init(ctx, &s->dbuf);
    js_object_list_init(&s->object_list);
    
    if (JS_WriteObjectRec(s, obj))
        goto fail;
    if (JS_WriteObjectAtoms(s))
        goto fail;
    js_object_list_end(ctx, &s->object_list);
    js_free(ctx, s->atom_to_idx);
    js_free(ctx, s->idx_to_atom);
    *psize = s->dbuf.size;
    if (psab_tab)
        *psab_tab = s->sab_tab;
    if (psab_tab_len)
        *psab_tab_len = s->sab_tab_len;
    return s->dbuf.buf;
 fail:
    js_object_list_end(ctx, &s->object_list);
    js_free(ctx, s->atom_to_idx);
    js_free(ctx, s->idx_to_atom);
    dbuf_free(&s->dbuf);
    *psize = 0;
    if (psab_tab)
        *psab_tab = NULL;
    if (psab_tab_len)
        *psab_tab_len = 0;
    return NULL;
}